

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.h
# Opt level: O2

void __thiscall
mvm::disassembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::
parse<unsigned_int,4ul,mvm::num::little_endian_tag>
          (disassembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer> *this,
          string *instr)

{
  long lVar1;
  undefined8 *puVar2;
  allocator<char> local_39;
  string local_38;
  
  lVar1 = *(long *)(this + 8);
  ip::increment((ip *)this,4);
  if ((*(ulong *)(this + 0x10) <= *(ulong *)(this + 8)) &&
     (*(ulong *)(this + 8) <= *(ulong *)(this + 0x18))) {
    std::__cxx11::to_string(&local_38,*(uint *)(lVar1 + 1));
    std::__cxx11::string::append((string *)instr);
    std::__cxx11::string::~string((string *)&local_38);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"[-][mvm] bytecode overflow",&local_39);
  *puVar2 = &PTR__mexcept_0011dcf0;
  *(undefined2 *)(puVar2 + 1) = 6;
  __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
}

Assistant:

void disassembler<Set, MetaCodeImpl>::parse(std::string &instr) {
  uint8_t *ip = m_rebased_ip;
  m_rebased_ip += N;

  if (!m_rebased_ip.assert_in_chunk()) {
    throw mexcept("[-][mvm] bytecode overflow", status_type::CODE_OVERFLOW);
  }

  instr.append(
      std::to_string(code_impl_type{}.template parse<T, N, Endian>(ip + 1)));
}